

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_hdwallet.cpp
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* cfd::core::HDWallet::ConvertEntropyToMnemonic
            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *__return_storage_ptr__,ByteData *entropy,string *language)

{
  bool bVar1;
  CfdException *this;
  allocator local_59;
  string local_58;
  CfdSourceLocation local_38;
  string *local_20;
  string *language_local;
  ByteData *entropy_local;
  
  local_20 = language;
  language_local = (string *)entropy;
  entropy_local = (ByteData *)__return_storage_ptr__;
  bVar1 = CheckSupportedLanguages(language);
  if (!bVar1) {
    local_38.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/src/cfdcore_hdwallet.cpp"
                 ,0x2f);
    local_38.filename = local_38.filename + 1;
    local_38.line = 0x167;
    local_38.funcname = "ConvertEntropyToMnemonic";
    logger::warn<std::__cxx11::string_const&>
              (&local_38,"Not support language passed. language=[{}]",local_20);
    this = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_58,"Not support language passed.",&local_59);
    CfdException::CfdException(this,kCfdIllegalArgumentError,&local_58);
    __cxa_throw(this,&CfdException::typeinfo,CfdException::~CfdException);
  }
  WallyUtil::ConvertEntropyToMnemonic(__return_storage_ptr__,(ByteData *)language_local,local_20);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string> HDWallet::ConvertEntropyToMnemonic(
    const ByteData& entropy, const std::string& language) {
  if (!CheckSupportedLanguages(language)) {
    warn(
        CFD_LOG_SOURCE, "Not support language passed. language=[{}]",
        language);
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Not support language passed.");
  }

  return WallyUtil::ConvertEntropyToMnemonic(entropy, language);
}